

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O0

int labeled_expand(ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher,void *output,size_t outlen,
                  ptls_iovec_t prk,char *label,ptls_iovec_t info)

{
  size_t len;
  ptls_iovec_t info_00;
  ptls_hash_algorithm_t *local_c8;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined2 local_9e;
  int local_9c;
  undefined1 local_98 [2];
  uint16_t _v;
  int ret;
  uint8_t labeled_info_smallbuf [64];
  ptls_buffer_t labeled_info;
  size_t outlen_local;
  void *output_local;
  ptls_hpke_cipher_suite_t *cipher_local;
  ptls_hpke_kem_t *kem_local;
  ptls_iovec_t prk_local;
  
  if (0xfffe < outlen) {
    __assert_fail("outlen < UINT16_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/hpke.c",
                  0x4d,
                  "int labeled_expand(ptls_hpke_kem_t *, ptls_hpke_cipher_suite_t *, void *, size_t, ptls_iovec_t, const char *, ptls_iovec_t)"
                 );
  }
  ptls_buffer_init((ptls_buffer_t *)(labeled_info_smallbuf + 0x38),local_98,0x40);
  local_9e = (undefined2)outlen;
  local_a0 = (undefined1)(outlen >> 8);
  local_9f = (undefined1)outlen;
  local_9c = ptls_buffer__do_pushv((ptls_buffer_t *)(labeled_info_smallbuf + 0x38),&local_a0,2);
  if (((local_9c == 0) &&
      (local_9c = ptls_buffer__do_pushv((ptls_buffer_t *)(labeled_info_smallbuf + 0x38),"HPKE-v1",7)
      , local_9c == 0)) &&
     (local_9c = build_suite_id((ptls_buffer_t *)(labeled_info_smallbuf + 0x38),kem,cipher),
     local_9c == 0)) {
    len = strlen(label);
    local_9c = ptls_buffer__do_pushv((ptls_buffer_t *)(labeled_info_smallbuf + 0x38),label,len);
    if (local_9c == 0) {
      local_9c = ptls_buffer__do_pushv
                           ((ptls_buffer_t *)(labeled_info_smallbuf + 0x38),info.base,info.len);
      if (local_9c == 0) {
        if (cipher == (ptls_hpke_cipher_suite_t *)0x0) {
          local_c8 = kem->hash;
        }
        else {
          local_c8 = cipher->hash;
        }
        info_00 = ptls_iovec_init((void *)labeled_info_smallbuf._56_8_,labeled_info.capacity);
        local_9c = ptls_hkdf_expand(local_c8,output,outlen,prk,info_00);
      }
    }
  }
  ptls_buffer_dispose((ptls_buffer_t *)(labeled_info_smallbuf + 0x38));
  return local_9c;
}

Assistant:

static int labeled_expand(ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher, void *output, size_t outlen, ptls_iovec_t prk,
                          const char *label, ptls_iovec_t info)
{
    ptls_buffer_t labeled_info;
    uint8_t labeled_info_smallbuf[64];
    int ret;

    assert(outlen < UINT16_MAX);

    ptls_buffer_init(&labeled_info, labeled_info_smallbuf, sizeof(labeled_info_smallbuf));

    ptls_buffer_push16(&labeled_info, (uint16_t)outlen);
    ptls_buffer_pushv(&labeled_info, HPKE_V1_LABEL, strlen(HPKE_V1_LABEL));
    if ((ret = build_suite_id(&labeled_info, kem, cipher)) != 0)
        goto Exit;
    ptls_buffer_pushv(&labeled_info, label, strlen(label));
    ptls_buffer_pushv(&labeled_info, info.base, info.len);

    ret = ptls_hkdf_expand(cipher != NULL ? cipher->hash : kem->hash, output, outlen, prk,
                           ptls_iovec_init(labeled_info.base, labeled_info.off));

Exit:
    ptls_buffer_dispose(&labeled_info);
    return ret;
}